

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osal.c
# Opt level: O1

int osal_gettimeofday(timeval *tv,timezone *tz)

{
  int iVar1;
  timespec ts;
  timespec local_20;
  
  iVar1 = clock_gettime(1,&local_20);
  tv->tv_sec = local_20.tv_sec;
  tv->tv_usec = local_20.tv_nsec / 1000;
  return iVar1;
}

Assistant:

int osal_gettimeofday(struct timeval *tv, struct timezone *tz)
{
   struct timespec ts;
   int return_value;
   
   /* Use clock_gettime to prevent possible live-lock.
    * Gettimeofday uses CLOCK_REALTIME that can get NTP timeadjust.
    * If this function preempts timeadjust and it uses vpage it live-locks.
    * Also when using XENOMAI, only clock_gettime is RT safe */
#ifdef RTNET
   RTIME rt = rt_timer_read();
   tv->tv_sec = rt / 1e9;
   tv->tv_usec = (rt % (int)1e9) / 1000;
   return return_value;
#else
   return_value = clock_gettime (CLOCK_MONOTONIC, &ts), 0;
   tv->tv_sec = ts.tv_sec;
   tv->tv_usec = ts.tv_nsec / 1000;
   return return_value;
#endif
}